

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageSaveTotals(Fts5Storage *p)

{
  int local_2c;
  undefined1 auStack_28 [4];
  int rc;
  Fts5Buffer buf;
  int i;
  int nCol;
  Fts5Storage *p_local;
  
  buf.nSpace = p->pConfig->nCol;
  local_2c = 0;
  memset(auStack_28,0,0x10);
  sqlite3Fts5BufferAppendVarint(&local_2c,(Fts5Buffer *)auStack_28,p->nTotalRow);
  for (buf.n = 0; buf.n < buf.nSpace; buf.n = buf.n + 1) {
    sqlite3Fts5BufferAppendVarint(&local_2c,(Fts5Buffer *)auStack_28,p->aTotalSize[buf.n]);
  }
  if (local_2c == 0) {
    local_2c = sqlite3Fts5IndexSetAverages(p->pIndex,_auStack_28,(int)buf.p);
  }
  sqlite3_free(_auStack_28);
  return local_2c;
}

Assistant:

static int fts5StorageSaveTotals(Fts5Storage *p){
  int nCol = p->pConfig->nCol;
  int i;
  Fts5Buffer buf;
  int rc = SQLITE_OK;
  memset(&buf, 0, sizeof(buf));

  sqlite3Fts5BufferAppendVarint(&rc, &buf, p->nTotalRow);
  for(i=0; i<nCol; i++){
    sqlite3Fts5BufferAppendVarint(&rc, &buf, p->aTotalSize[i]);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexSetAverages(p->pIndex, buf.p, buf.n);
  }
  sqlite3_free(buf.p);

  return rc;
}